

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> __thiscall
enact::Parser::parseImplStmt(Parser *this)

{
  TokenType TVar1;
  bool bVar2;
  ParseError *__return_storage_ptr__;
  Parser *in_RSI;
  allocator<char> local_89;
  undefined1 local_88 [8];
  string local_80;
  undefined1 local_60 [24];
  vector<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>,_std::allocator<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>_>_>
  methods;
  
  local_60._8_8_ = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_88 + 8),"Expected typename after \'impl\'.",
             (allocator<char> *)&methods);
  expectTypenamePrecFunction((Parser *)local_60,(string *)in_RSI,(bool)((char)local_88 + '\b'));
  std::__cxx11::string::~string((string *)(local_88 + 8));
  bVar2 = consume(in_RSI,FOR);
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_88 + 8),"Expected typename after \'impl\'..\'for\'.",
               (allocator<char> *)&methods);
    expectTypenamePrecFunction((Parser *)local_88,(string *)in_RSI,(bool)((char)local_88 + '\b'));
    std::__cxx11::string::~string((string *)(local_88 + 8));
  }
  else {
    local_88 = (undefined1  [8])0x0;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_88 + 8),"Expected \'{\' before impl body.",(allocator<char> *)&methods
            );
  expect(in_RSI,LEFT_BRACE,(string *)(local_88 + 8));
  std::__cxx11::string::~string((string *)(local_88 + 8));
  methods.
  super__Vector_base<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>,_std::allocator<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  methods.
  super__Vector_base<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>,_std::allocator<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  methods.
  super__Vector_base<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>,_std::allocator<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  while ((TVar1 = (in_RSI->m_current).type, TVar1 != RIGHT_BRACE && (TVar1 != END_OF_FILE))) {
    bVar2 = consume(in_RSI,FUNC);
    if (!bVar2) {
      __return_storage_ptr__ = (ParseError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_88 + 8),"Expected method declaration in impl body.",&local_89);
      errorAtCurrent(__return_storage_ptr__,in_RSI,(string *)(local_88 + 8));
      __cxa_throw(__return_storage_ptr__,&ParseError::typeinfo,std::runtime_error::~runtime_error);
    }
    parseFunctionStmt((Parser *)(local_60 + 0x10),SUB81(in_RSI,0));
    local_80._M_dataplus._M_p = (pointer)local_60._16_8_;
    std::
    vector<std::unique_ptr<enact::FunctionStmt,std::default_delete<enact::FunctionStmt>>,std::allocator<std::unique_ptr<enact::FunctionStmt,std::default_delete<enact::FunctionStmt>>>>
    ::emplace_back<std::unique_ptr<enact::FunctionStmt,std::default_delete<enact::FunctionStmt>>>
              ((vector<std::unique_ptr<enact::FunctionStmt,std::default_delete<enact::FunctionStmt>>,std::allocator<std::unique_ptr<enact::FunctionStmt,std::default_delete<enact::FunctionStmt>>>>
                *)&methods,
               (unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_> *)
               (local_88 + 8));
    if ((_func_int **)local_80._M_dataplus._M_p != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_80._M_dataplus._M_p + 8))();
    }
    local_60._16_8_ = (pointer)0x0;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_88 + 8),"Expected \'}\' after impl body.",&local_89);
  expect(in_RSI,RIGHT_BRACE,(string *)(local_88 + 8));
  std::__cxx11::string::~string((string *)(local_88 + 8));
  if (local_88 == (undefined1  [8])0x0) {
    std::
    make_unique<enact::ImplStmt,std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::vector<std::unique_ptr<enact::FunctionStmt,std::default_delete<enact::FunctionStmt>>,std::allocator<std::unique_ptr<enact::FunctionStmt,std::default_delete<enact::FunctionStmt>>>>>
              ((unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *)
               (local_88 + 8),
               (unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *)
               local_60,(vector<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>,_std::allocator<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>_>_>
                         *)local_88);
  }
  else {
    std::
    make_unique<enact::ImplStmt,std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::vector<std::unique_ptr<enact::FunctionStmt,std::default_delete<enact::FunctionStmt>>,std::allocator<std::unique_ptr<enact::FunctionStmt,std::default_delete<enact::FunctionStmt>>>>>
              ((unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *)
               (local_88 + 8),
               (unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *)
               local_88,(vector<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>,_std::allocator<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>_>_>
                         *)local_60);
  }
  *(pointer *)local_60._8_8_ = local_80._M_dataplus._M_p;
  std::
  vector<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>,_std::allocator<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>_>_>
  ::~vector(&methods);
  if (local_88 != (undefined1  [8])0x0) {
    (**(code **)((((string *)local_88)->_M_dataplus)._M_p + 8))();
  }
  if ((tuple<const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>)local_60._0_8_ !=
      (_Head_base<0UL,_const_enact::Typename_*,_false>)0x0) {
    (**(code **)(*(long *)local_60._0_8_ + 8))();
  }
  return (unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>)(Stmt *)local_60._8_8_;
}

Assistant:

std::unique_ptr<Stmt> Parser::parseImplStmt() {
        std::unique_ptr<const Typename> firstTypename = expectTypename("Expected typename after 'impl'.");
        std::unique_ptr<const Typename> secondTypename = consume(TokenType::FOR)
                                                         ? expectTypename("Expected typename after 'impl'..'for'.")
                                                         : nullptr;

        expect(TokenType::LEFT_BRACE, "Expected '{' before impl body.");

        std::vector<std::unique_ptr<FunctionStmt>> methods;
        while (!check(TokenType::RIGHT_BRACE) && !isAtEnd()) {
            if (consume(TokenType::FUNC)) {
                methods.push_back(
                        static_unique_ptr_cast<FunctionStmt>(
                                parseFunctionStmt()));
            } else {
                throw errorAtCurrent("Expected method declaration in impl body.");
            }
        }

        expect(TokenType::RIGHT_BRACE, "Expected '}' after impl body.");

        if (secondTypename == nullptr) {
            // Inherent impl
            return std::make_unique<ImplStmt>(std::move(firstTypename), std::move(secondTypename), std::move(methods));
        }
        // Trait impl
        return std::make_unique<ImplStmt>(std::move(secondTypename), std::move(firstTypename), std::move(methods));
    }